

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigPhase.c
# Opt level: O2

void Saig_TsiStop(Saig_Tsim_t *p)

{
  Vec_Int_t *__ptr;
  Vec_Ptr_t *__ptr_00;
  
  __ptr = p->vNonXRegs;
  if (__ptr != (Vec_Int_t *)0x0) {
    free(__ptr->pArray);
    free(__ptr);
  }
  Aig_MmFixedStop(p->pMem,0);
  __ptr_00 = p->vStates;
  free(__ptr_00->pArray);
  free(__ptr_00);
  free(p->pBins);
  free(p);
  return;
}

Assistant:

void Saig_TsiStop( Saig_Tsim_t * p )
{
    if ( p->vNonXRegs )
        Vec_IntFree( p->vNonXRegs );
    Aig_MmFixedStop( p->pMem, 0 );
    Vec_PtrFree( p->vStates );
    ABC_FREE( p->pBins );
    ABC_FREE( p );
}